

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O3

idx_t duckdb::InitialNestedLoopJoin::Operation<unsigned_int,duckdb::LessThanEquals>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  bool bVar8;
  bool bVar9;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  uVar4 = *rpos;
  if (uVar4 < right_size) {
    psVar1 = (local_c0.sel)->sel_vector;
    iVar7 = 0;
    do {
      if (psVar1 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar1[uVar4];
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar8 = false;
      }
      else {
        bVar8 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0;
      }
      uVar6 = *lpos;
      if (uVar6 < left_size) {
        psVar2 = lvector->sel_vector;
        psVar3 = rvector->sel_vector;
        do {
          if (iVar7 == 0x800) {
            iVar7 = 0x800;
            goto LAB_014bb69c;
          }
          uVar5 = uVar6;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)(local_78.sel)->sel_vector[uVar6];
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0;
          }
          if ((!bVar9 && !bVar8) &&
             (*(uint *)(local_78.data + uVar5 * 4) <= *(uint *)(local_c0.data + uVar4 * 4))) {
            psVar2[iVar7] = (sel_t)uVar6;
            psVar3[iVar7] = (sel_t)*rpos;
            iVar7 = iVar7 + 1;
          }
          uVar6 = uVar6 + 1;
          *lpos = uVar6;
        } while (left_size != uVar6);
      }
      *lpos = 0;
      uVar4 = *rpos + 1;
      *rpos = uVar4;
    } while (uVar4 < right_size);
  }
  else {
    iVar7 = 0;
  }
LAB_014bb69c:
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar7;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		// initialize phase of nested loop join
		// fill lvector and rvector with matches from the base vectors
		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (; rpos < right_size; rpos++) {
			idx_t right_position = right_data.sel->get_index(rpos);
			bool right_is_valid = right_data.validity.RowIsValid(right_position);
			for (; lpos < left_size; lpos++) {
				if (result_count == STANDARD_VECTOR_SIZE) {
					// out of space!
					return result_count;
				}
				idx_t left_position = left_data.sel->get_index(lpos);
				bool left_is_valid = left_data.validity.RowIsValid(left_position);
				if (MATCH_OP::Operation(ldata[left_position], rdata[right_position], !left_is_valid, !right_is_valid)) {
					// emit tuple
					lvector.set_index(result_count, lpos);
					rvector.set_index(result_count, rpos);
					result_count++;
				}
			}
			lpos = 0;
		}
		return result_count;
	}